

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O2

void __thiscall ON_Buffer::Copy(ON_Buffer *this,ON_Buffer *src)

{
  ON_BUFFER_SEGMENT *pOVar1;
  ON_BUFFER_SEGMENT *pOVar2;
  ON_BUFFER_SEGMENT *pOVar3;
  ulong uVar4;
  ON_BUFFER_SEGMENT **ppOVar5;
  size_t __n;
  
  ppOVar5 = &src->m_first_segment;
  do {
    pOVar1 = *ppOVar5;
    if (pOVar1 == (ON_BUFFER_SEGMENT *)0x0) {
LAB_0047d2f2:
      if (src->m_current_position <= this->m_buffer_size) {
        this->m_current_position = src->m_current_position;
      }
      return;
    }
    uVar4 = this->m_buffer_size;
    if ((uVar4 != pOVar1->m_segment_position0) ||
       (src->m_buffer_size <= pOVar1->m_segment_position0)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x2d9,"","Attempt to copy corrupt source.");
      goto LAB_0047d2f2;
    }
    __n = pOVar1->m_segment_position1 - uVar4;
    if (pOVar1->m_segment_position1 < uVar4 || __n == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x2df,"","Attempt to copy corrupt source.");
    }
    else {
      if (pOVar1->m_segment_buffer == (uchar *)0x0) {
        __n = 0;
      }
      pOVar3 = (ON_BUFFER_SEGMENT *)onmalloc(__n + 0x30);
      pOVar3->m_prev_segment = (ON_BUFFER_SEGMENT *)0x0;
      pOVar3->m_next_segment = (ON_BUFFER_SEGMENT *)0x0;
      pOVar3->m_segment_position0 = 0;
      pOVar3->m_segment_position1 = 0;
      pOVar3->m_segment_buffer = (uchar *)0x0;
      pOVar3->m_reserved = (void *)0x0;
      if (__n != 0) {
        pOVar3->m_segment_buffer = (uchar *)(pOVar3 + 1);
        memcpy(pOVar3 + 1,pOVar1->m_segment_buffer,__n);
      }
      if (this->m_first_segment == (ON_BUFFER_SEGMENT *)0x0) {
        this->m_first_segment = pOVar3;
      }
      pOVar2 = this->m_last_segment;
      pOVar3->m_prev_segment = pOVar2;
      if (pOVar2 != (ON_BUFFER_SEGMENT *)0x0) {
        pOVar2->m_next_segment = pOVar3;
      }
      this->m_last_segment = pOVar3;
      pOVar3->m_segment_position0 = pOVar1->m_segment_position0;
      uVar4 = pOVar1->m_segment_position1;
      pOVar3->m_segment_position1 = uVar4;
      if (src->m_buffer_size < uVar4) {
        uVar4 = src->m_buffer_size;
      }
      this->m_buffer_size = uVar4;
    }
    ppOVar5 = &pOVar1->m_next_segment;
  } while( true );
}

Assistant:

void ON_Buffer::Copy( const ON_Buffer& src )
{
  const struct ON_BUFFER_SEGMENT* src_seg;
  struct ON_BUFFER_SEGMENT* dst_seg;
  for ( src_seg = src.m_first_segment; 0 != src_seg; src_seg = src_seg->m_next_segment )
  {
    if (    m_buffer_size != src_seg->m_segment_position0 
         || src_seg->m_segment_position0 >= src.m_buffer_size
        )
    {
      ON_ERROR("Attempt to copy corrupt source.");
      break;
    }
    if ( src_seg->m_segment_position0 >= src_seg->m_segment_position1 
        )
    {
      ON_ERROR("Attempt to copy corrupt source.");
      continue;
    }
    ON__UINT64 segment_buffer_size = ( 0 != src_seg->m_segment_buffer)
                               ? src_seg->m_segment_position1 - src_seg->m_segment_position0
                               : 0;
    dst_seg = (struct ON_BUFFER_SEGMENT*)onmalloc(sizeof(*dst_seg) + ((size_t)segment_buffer_size) );
    memset(dst_seg,0,sizeof(*dst_seg));

    if ( segment_buffer_size > 0 )
    {
      dst_seg->m_segment_buffer = (unsigned char*)(dst_seg+1);
      memcpy( dst_seg->m_segment_buffer, src_seg->m_segment_buffer, (size_t)segment_buffer_size ); // segment_buffer_size always < 0xFFFFFFFF
    }

    if ( 0 == m_first_segment )
      m_first_segment = dst_seg;
    dst_seg->m_prev_segment = m_last_segment;
    if ( 0 != m_last_segment )
      m_last_segment->m_next_segment = dst_seg;
    m_last_segment = dst_seg;
    dst_seg->m_segment_position0 = src_seg->m_segment_position0;
    dst_seg->m_segment_position1 = src_seg->m_segment_position1;
    m_buffer_size = (src.m_buffer_size < dst_seg->m_segment_position1)
                  ? src.m_buffer_size
                  : dst_seg->m_segment_position1;
  }
  if ( src.m_current_position <= m_buffer_size )
    m_current_position = src.m_current_position;
  // 27 June, 2001 Dale Lear: Should this copy m_last_error and m_error_handler? Not sure.
}